

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileStorageManager::LoadDatabase
          (SingleFileStorageManager *this,StorageOptions storage_options)

{
  string *psVar1;
  unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true> *this_00;
  AttachedDatabase *pAVar2;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var3;
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var4;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> _Var5;
  optional_idx block_alloc_size_p;
  _func_int **pp_Var6;
  optional_idx *this_01;
  byte bVar7;
  int iVar8;
  string *psVar9;
  DBConfig *pDVar10;
  TableIOManager TVar11;
  BufferManager *buffer_manager;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var12;
  idx_t iVar13;
  SingleFileBlockManager *pSVar14;
  pointer pSVar15;
  TableIOManager TVar16;
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var17;
  pointer pBVar18;
  idx_t iVar19;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> this_02;
  NotImplementedException *pNVar20;
  InvalidInputException *pIVar21;
  SingleFileCheckpointReader checkpoint_reader;
  string local_b8;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> local_98;
  string *local_90;
  SingleFileCheckpointReader local_88;
  StorageManagerOptions local_70;
  optional_idx *local_40;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> local_38;
  
  psVar1 = &(this->super_StorageManager).path;
  iVar8 = ::std::__cxx11::string::compare((char *)psVar1);
  pAVar2 = (this->super_StorageManager).db;
  if (iVar8 == 0) {
    buffer_manager = BufferManager::GetBufferManager(pAVar2);
    _Var12._M_head_impl = (BlockManager *)operator_new(0x88);
    optional_idx::optional_idx((optional_idx *)&local_70,0x40000);
    optional_idx::optional_idx((optional_idx *)&local_b8,8);
    block_alloc_size_p.index._1_1_ = local_70.use_direct_io;
    block_alloc_size_p.index._0_1_ = local_70.read_only;
    block_alloc_size_p.index._2_1_ = local_70.debug_initialize;
    block_alloc_size_p.index._3_5_ = local_70._3_5_;
    BlockManager::BlockManager
              (_Var12._M_head_impl,buffer_manager,block_alloc_size_p,
               (optional_idx)local_b8._M_dataplus._M_p);
    (_Var12._M_head_impl)->_vptr_BlockManager = (_func_int **)&PTR__BlockManager_0246c630;
    _Var3._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var12._M_head_impl;
    if (_Var3._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar11._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(&this->block_manager);
    _Var17._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var17._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_0246c710;
    _Var17._M_head_impl[1]._vptr_TableIOManager = TVar11._vptr_TableIOManager;
    _Var17._M_head_impl[2]._vptr_TableIOManager = (_func_int **)0x1e000;
    _Var4._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var17._M_head_impl;
    if (_Var4._M_head_impl == (TableIOManager *)0x0) {
      return;
    }
    (*(_Var4._M_head_impl)->_vptr_TableIOManager[1])();
    return;
  }
  psVar9 = (string *)FileSystem::Get(pAVar2);
  pDVar10 = DBConfig::Get((this->super_StorageManager).db);
  local_70.version_number.index._0_4_ = 0xffffffff;
  local_70.version_number.index._4_4_ = 0xffffffff;
  local_70.block_header_size.index = 0xffffffffffffffff;
  local_70.block_alloc_size.index = 0xffffffffffffffff;
  local_70.encryption = false;
  bVar7 = (this->super_StorageManager).read_only;
  local_70.use_direct_io = (pDVar10->options).use_direct_io;
  local_70.debug_initialize = (pDVar10->options).debug_initialize;
  local_70.storage_version.index = storage_options.storage_version.index;
  local_70.read_only = (bool)bVar7;
  if (storage_options.row_group_size.index == 0xffffffffffffffff) {
    TVar11._vptr_TableIOManager = (_func_int **)0x1e000;
  }
  else {
    TVar11._vptr_TableIOManager =
         (_func_int **)optional_idx::GetIndex(&storage_options.row_group_size);
    if (TVar11._vptr_TableIOManager == (_func_int **)0x0) {
      pNVar20 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "Invalid row group size: %llu - row group size must be bigger than 0","");
      NotImplementedException::NotImplementedException<unsigned_long>(pNVar20,&local_b8,0);
      __cxa_throw(pNVar20,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((ulong)TVar11._vptr_TableIOManager & 0x7ff) != 0) {
      pNVar20 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)"
                 ,"");
      NotImplementedException::NotImplementedException<unsigned_long,unsigned_int>
                (pNVar20,&local_b8,(unsigned_long)TVar11._vptr_TableIOManager,0x800);
      __cxa_throw(pNVar20,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar7 = (this->super_StorageManager).read_only;
  }
  if (((bVar7 & 1) == 0) &&
     (iVar8 = (**(_func_int **)((long)(psVar9->_M_dataplus)._M_p + 0x90))(psVar9,psVar1,0),
     (char)iVar8 == '\0')) {
    local_90 = psVar1;
    StorageManager::GetWALPath_abi_cxx11_(&local_b8,&this->super_StorageManager);
    iVar8 = (**(_func_int **)((long)(psVar9->_M_dataplus)._M_p + 0x90))(psVar9,&local_b8,0);
    if ((char)iVar8 != '\0') {
      (**(_func_int **)((long)(psVar9->_M_dataplus)._M_p + 0xa0))(psVar9,&local_b8,0);
    }
    if (storage_options.block_alloc_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_88,(pDVar10->options).default_block_alloc_size);
      local_70.block_alloc_size.index =
           (idx_t)local_88.super_CheckpointReader._vptr_CheckpointReader;
    }
    else {
      iVar13 = optional_idx::GetIndex(&storage_options.block_alloc_size);
      Storage::VerifyBlockAllocSize(iVar13);
      local_70.block_alloc_size = storage_options.block_alloc_size;
    }
    if (storage_options.block_header_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_88,(pDVar10->options).default_block_header_size);
      local_70.block_header_size.index =
           (idx_t)local_88.super_CheckpointReader._vptr_CheckpointReader;
    }
    else {
      iVar13 = optional_idx::GetIndex(&storage_options.block_header_size);
      Storage::VerifyBlockHeaderSize(iVar13);
      local_70.block_header_size.index = storage_options.block_header_size.index;
      local_70.encryption = storage_options.encryption;
      local_70.storage_version.index = storage_options.storage_version.index;
    }
    if ((pointer)local_70.storage_version.index == (pointer)0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_88,
                 (pDVar10->options).serialization_compatibility.serialization_version);
      local_70.storage_version.index = (idx_t)local_88.super_CheckpointReader._vptr_CheckpointReader
      ;
    }
    pAVar2 = (this->super_StorageManager).db;
    pSVar14 = (SingleFileBlockManager *)operator_new(0x240);
    SingleFileBlockManager::SingleFileBlockManager(pSVar14,pAVar2,local_90,&local_70);
    local_88.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)pSVar14;
    pSVar15 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
              ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                            *)&local_88);
    SingleFileBlockManager::CreateNewDatabase(pSVar15);
    pp_Var6 = local_88.super_CheckpointReader._vptr_CheckpointReader;
    local_88.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)0x0;
    _Var3._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)pp_Var6;
    if (_Var3._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar16._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(&this->block_manager);
    _Var17._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var17._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_0246c710;
    _Var17._M_head_impl[1]._vptr_TableIOManager = TVar16._vptr_TableIOManager;
    _Var17._M_head_impl[2]._vptr_TableIOManager = TVar11._vptr_TableIOManager;
    _Var4._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var17._M_head_impl;
    if (_Var4._M_head_impl != (TableIOManager *)0x0) {
      (*(_Var4._M_head_impl)->_vptr_TableIOManager[1])();
    }
    pAVar2 = (this->super_StorageManager).db;
    this_02._M_head_impl = (WriteAheadLog *)operator_new(0x70);
    WriteAheadLog::WriteAheadLog(this_02._M_head_impl,pAVar2,&local_b8,0,NO_WAL);
    _Var5._M_head_impl =
         (this->super_StorageManager).wal.
         super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
         .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
    (this->super_StorageManager).wal.
    super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
    super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = this_02._M_head_impl;
    if (_Var5._M_head_impl != (WriteAheadLog *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_WriteAheadLog + 8))();
    }
    if (local_88.super_CheckpointReader._vptr_CheckpointReader != (_func_int **)0x0) {
      (**(code **)(*local_88.super_CheckpointReader._vptr_CheckpointReader + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    local_40 = &storage_options.block_header_size;
    local_90 = psVar9;
    if (storage_options.block_header_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_b8,(pDVar10->options).default_block_header_size);
      local_70.block_header_size.index = (idx_t)local_b8._M_dataplus._M_p;
    }
    else {
      iVar13 = optional_idx::GetIndex(local_40);
      Storage::VerifyBlockHeaderSize(iVar13);
      local_70.encryption = storage_options.encryption;
      local_70.storage_version.index = storage_options.storage_version.index;
      local_70.block_header_size = storage_options.block_header_size;
    }
    pAVar2 = (this->super_StorageManager).db;
    pSVar14 = (SingleFileBlockManager *)operator_new(0x240);
    SingleFileBlockManager::SingleFileBlockManager(pSVar14,pAVar2,psVar1,&local_70);
    local_98._M_head_impl = (BlockManager *)pSVar14;
    pSVar15 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
              ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                            *)&local_98);
    SingleFileBlockManager::LoadExistingDatabase(pSVar15);
    _Var12._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (BlockManager *)0x0;
    this_00 = &this->block_manager;
    _Var3._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var12._M_head_impl;
    if (_Var3._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar16._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(this_00);
    psVar1 = local_90;
    _Var17._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var17._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_0246c710;
    _Var17._M_head_impl[1]._vptr_TableIOManager = TVar16._vptr_TableIOManager;
    _Var17._M_head_impl[2]._vptr_TableIOManager = TVar11._vptr_TableIOManager;
    _Var4._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var17._M_head_impl;
    if (_Var4._M_head_impl != (TableIOManager *)0x0) {
      (*(_Var4._M_head_impl)->_vptr_TableIOManager[1])();
    }
    if (storage_options.block_alloc_size.index != 0xffffffffffffffff) {
      iVar13 = optional_idx::GetIndex(&storage_options.block_alloc_size);
      pBVar18 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_00);
      iVar19 = optional_idx::GetIndex(&pBVar18->block_alloc_size);
      if (iVar13 != iVar19) {
        pIVar21 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "block size parameter does not match the file\'s block size, got %llu, expected %llu"
                   ,"");
        iVar13 = optional_idx::GetIndex(&storage_options.block_alloc_size);
        pBVar18 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                  ::operator->(this_00);
        iVar19 = optional_idx::GetIndex(&pBVar18->block_alloc_size);
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar21,&local_b8,iVar13,iVar19);
        __cxa_throw(pIVar21,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    this_01 = local_40;
    if (local_40->index != 0xffffffffffffffff) {
      iVar13 = optional_idx::GetIndex(local_40);
      pBVar18 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_00);
      if ((pBVar18->block_header_size).index == 0xffffffffffffffff) {
        iVar19 = 8;
      }
      else {
        iVar19 = optional_idx::GetIndex(&pBVar18->block_header_size);
      }
      if (iVar13 != iVar19) {
        pIVar21 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "block header size does not match the file\'s block header size, got %llu, expected %llu"
                   ,"");
        iVar13 = optional_idx::GetIndex(this_01);
        pBVar18 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                  ::operator->(this_00);
        iVar19 = 8;
        if ((pBVar18->block_header_size).index != 0xffffffffffffffff) {
          iVar19 = optional_idx::GetIndex(&pBVar18->block_header_size);
        }
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar21,&local_b8,iVar13,iVar19);
        __cxa_throw(pIVar21,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    local_88.super_CheckpointReader.catalog = Catalog::GetCatalog((this->super_StorageManager).db);
    local_88.super_CheckpointReader._vptr_CheckpointReader =
         (_func_int **)&PTR__CheckpointReader_0246c3f0;
    local_88.storage = this;
    SingleFileCheckpointReader::LoadFromStorage(&local_88);
    StorageManager::GetWALPath_abi_cxx11_(&local_b8,&this->super_StorageManager);
    WriteAheadLog::Replay
              ((WriteAheadLog *)&stack0xffffffffffffffc8,(FileSystem *)psVar1,
               (this->super_StorageManager).db,&local_b8);
    _Var5._M_head_impl =
         (this->super_StorageManager).wal.
         super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
         .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
    (this->super_StorageManager).wal.
    super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
    super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = local_38._M_head_impl;
    if (_Var5._M_head_impl != (WriteAheadLog *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_WriteAheadLog + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (local_98._M_head_impl != (BlockManager *)0x0) {
      (*(local_98._M_head_impl)->_vptr_BlockManager[1])();
    }
  }
  if (((_func_int **)0x1e000 < TVar11._vptr_TableIOManager) &&
     (iVar13 = optional_idx::GetIndex(&(this->super_StorageManager).storage_version), iVar13 < 4)) {
    pIVar21 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "Unsupported row group size %llu - row group sizes >= 122_880 are only supported with STORAGE_VERSION \'1.2.0\' or above.\nExplicitly specify a newer storage version when creating the database to enable larger row groups"
               ,"");
    InvalidInputException::InvalidInputException<unsigned_long>
              (pIVar21,&local_b8,(unsigned_long)TVar11._vptr_TableIOManager);
    __cxa_throw(pIVar21,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (this->super_StorageManager).load_complete = true;
  return;
}

Assistant:

void SingleFileStorageManager::LoadDatabase(StorageOptions storage_options) {

	if (InMemory()) {
		block_manager = make_uniq<InMemoryBlockManager>(BufferManager::GetBufferManager(db), DEFAULT_BLOCK_ALLOC_SIZE,
		                                                DEFAULT_BLOCK_HEADER_STORAGE_SIZE);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, DEFAULT_ROW_GROUP_SIZE);
		return;
	}

	auto &fs = FileSystem::Get(db);
	auto &config = DBConfig::Get(db);

	StorageManagerOptions options;
	options.read_only = read_only;
	options.use_direct_io = config.options.use_direct_io;
	options.debug_initialize = config.options.debug_initialize;
	options.storage_version = storage_options.storage_version;

	idx_t row_group_size = DEFAULT_ROW_GROUP_SIZE;
	if (storage_options.row_group_size.IsValid()) {
		row_group_size = storage_options.row_group_size.GetIndex();
		if (row_group_size == 0) {
			throw NotImplementedException("Invalid row group size: %llu - row group size must be bigger than 0",
			                              row_group_size);
		}
		if (row_group_size % STANDARD_VECTOR_SIZE != 0) {
			throw NotImplementedException(
			    "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)",
			    row_group_size, STANDARD_VECTOR_SIZE);
		}
	}
	// Check if the database file already exists.
	// Note: a file can also exist if there was a ROLLBACK on a previous transaction creating that file.
	if (!read_only && !fs.FileExists(path)) {
		// file does not exist and we are in read-write mode
		// create a new file

		// check if a WAL file already exists
		auto wal_path = GetWALPath();
		if (fs.FileExists(wal_path)) {
			// WAL file exists but database file does not
			// remove the WAL
			fs.RemoveFile(wal_path);
		}

		// Set the block allocation size for the new database file.
		if (storage_options.block_alloc_size.IsValid()) {
			// Use the option provided by the user.
			Storage::VerifyBlockAllocSize(storage_options.block_alloc_size.GetIndex());
			options.block_alloc_size = storage_options.block_alloc_size;
		} else {
			// No explicit option provided: use the default option.
			options.block_alloc_size = config.options.default_block_alloc_size;
		}
		//! set the block header size for the encrypted database files
		//! set the database to encrypted
		//! update the storage version to 1.3.0
		if (storage_options.block_header_size.IsValid()) {
			// Use the header size for the corresponding encryption algorithm.
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No encryption; use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}
		if (!options.storage_version.IsValid()) {
			// when creating a new database we default to the serialization version specified in the config
			options.storage_version = config.options.serialization_compatibility.serialization_version;
		}

		// Initialize the block manager before creating a new database.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->CreateNewDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);
		wal = make_uniq<WriteAheadLog>(db, wal_path);
	} else {
		// Either the file exists, or we are in read-only mode, so we
		// try to read the existing file on disk.

		// set the block header size for the encrypted database files
		// (also if they already exist)
		if (storage_options.block_header_size.IsValid()) {
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No explicit option provided: use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}

		// Initialize the block manager while loading the database file.
		// We'll construct the SingleFileBlockManager with the default block allocation size,
		// and later adjust it when reading the file header.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->LoadExistingDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);

		if (storage_options.block_alloc_size.IsValid()) {
			// user-provided block alloc size
			idx_t block_alloc_size = storage_options.block_alloc_size.GetIndex();
			if (block_alloc_size != block_manager->GetBlockAllocSize()) {
				throw InvalidInputException(
				    "block size parameter does not match the file's block size, got %llu, expected %llu",
				    storage_options.block_alloc_size.GetIndex(), block_manager->GetBlockAllocSize());
			}
		}

		if (storage_options.block_header_size.IsValid()) {
			// block header size for encrypted database files
			idx_t block_header_size = storage_options.block_header_size.GetIndex();
			if (block_header_size != block_manager->GetBlockHeaderSize()) {
				throw InvalidInputException(
				    "block header size does not match the file's block header size, got %llu, expected %llu",
				    storage_options.block_header_size.GetIndex(), block_manager->GetBlockHeaderSize());
			}
		}

		// load the db from storage
		auto checkpoint_reader = SingleFileCheckpointReader(*this);
		checkpoint_reader.LoadFromStorage();

		auto wal_path = GetWALPath();
		wal = WriteAheadLog::Replay(fs, db, wal_path);
	}
	if (row_group_size > 122880ULL && GetStorageVersion() < 4) {
		throw InvalidInputException("Unsupported row group size %llu - row group sizes >= 122_880 are only supported "
		                            "with STORAGE_VERSION '1.2.0' or above.\nExplicitly specify a newer storage "
		                            "version when creating the database to enable larger row groups",
		                            row_group_size);
	}

	load_complete = true;
}